

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QByteArray * parseHtmlMetaForEncoding(QByteArrayView data)

{
  char cVar1;
  bool bVar2;
  qsizetype qVar3;
  size_t sVar4;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype colon;
  char ch;
  qsizetype pos2;
  qsizetype pos;
  QByteArray *name;
  QByteArray header;
  DataPointer *in_stack_fffffffffffffe88;
  QArrayDataPointer<char> *in_stack_fffffffffffffe90;
  QByteArray *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  QByteArray *in_stack_fffffffffffffea8;
  long lVar5;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  long n;
  QByteArray *pos_00;
  QByteArrayView *this;
  long local_100;
  long local_f8;
  QArrayDataPointer<char> local_d8 [2];
  char *local_a8;
  longlong local_70;
  qsizetype local_68;
  QByteArrayView local_60;
  QByteArray local_38;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this = &local_18;
  pos_00 = in_RDI;
  local_68 = QByteArrayView::size(this);
  local_70 = 0x400;
  qMin<long_long>(&local_68,&local_70);
  local_60 = QByteArrayView::first((QByteArrayView *)in_stack_fffffffffffffe88,0x5453d6);
  QByteArrayView::toByteArray((QByteArrayView *)in_stack_fffffffffffffe90);
  QByteArray::toLower((QByteArray *)in_stack_fffffffffffffe88);
  QByteArray::~QByteArray((QByteArray *)0x545421);
  qVar3 = QStaticByteArrayMatcher<6UL>::indexIn<void>
                    ((QStaticByteArrayMatcher<6UL> *)
                     CONCAT17(in_stack_fffffffffffffeb7,
                              CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),
                     in_stack_fffffffffffffea8,
                     CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  if ((qVar3 != -1) &&
     (qVar3 = QStaticByteArrayMatcher<9UL>::indexIn<void>
                        ((QStaticByteArrayMatcher<9UL> *)
                         CONCAT17(in_stack_fffffffffffffeb7,
                                  CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),
                         in_stack_fffffffffffffea8,
                         CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)), qVar3 != -1
     )) {
    sVar4 = qstrlen((char *)in_stack_fffffffffffffe90);
    local_f8 = sVar4 + qVar3;
    n = local_f8;
    qVar3 = QByteArray::size(&local_38);
    if ((n < qVar3) &&
       ((cVar1 = QByteArray::at((QByteArray *)in_stack_fffffffffffffe88,0x5454eb), cVar1 == '\"' ||
        (cVar1 = QByteArray::at((QByteArray *)in_stack_fffffffffffffe88,0x545512), cVar1 == '\''))))
    {
      local_f8 = local_f8 + 1;
    }
    local_100 = local_f8;
    while( true ) {
      local_100 = local_100 + 1;
      lVar5 = local_100;
      qVar3 = QByteArray::size(&local_38);
      if (qVar3 <= lVar5) break;
      cVar1 = QByteArray::at((QByteArray *)in_stack_fffffffffffffe88,0x5455d1);
      if ((((cVar1 == '\"') || (cVar1 == '\'')) || (cVar1 == '>')) || (cVar1 == '/')) {
        (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::mid((QByteArray *)this,(qsizetype)pos_00,(qsizetype)in_RDI);
        in_stack_fffffffffffffe98 =
             (QByteArray *)
             QByteArray::indexOf(in_stack_fffffffffffffe98,
                                 (char)((ulong)in_stack_fffffffffffffe90 >> 0x38),
                                 (qsizetype)in_stack_fffffffffffffe88);
        if (0 < (long)in_stack_fffffffffffffe98) {
          QByteArray::left((QByteArray *)CONCAT17(cVar1,in_stack_fffffffffffffea0),n);
          QByteArray::operator=
                    ((QByteArray *)in_stack_fffffffffffffe90,(QByteArray *)in_stack_fffffffffffffe88
                    );
          QByteArray::~QByteArray((QByteArray *)0x5456b0);
        }
        QByteArray::simplified((QByteArray *)in_stack_fffffffffffffe88);
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffe90,(QByteArray *)in_stack_fffffffffffffe88);
        QByteArray::~QByteArray((QByteArray *)0x545702);
        local_a8 = "unicode";
        bVar2 = operator==((QByteArray *)CONCAT17(cVar1,in_stack_fffffffffffffea0),
                           (char **)in_stack_fffffffffffffe98);
        if (bVar2) {
          in_stack_fffffffffffffe90 = local_d8;
          QArrayDataPointer<char>::QArrayDataPointer
                    (in_stack_fffffffffffffe90,(Data *)0x0,"UTF-8",5);
          QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          QByteArray::operator=
                    ((QByteArray *)in_stack_fffffffffffffe90,(QByteArray *)in_stack_fffffffffffffe88
                    );
          QByteArray::~QByteArray((QByteArray *)0x545781);
          QArrayDataPointer<char>::~QArrayDataPointer(in_stack_fffffffffffffe90);
        }
        bVar2 = QByteArray::isEmpty((QByteArray *)0x5457c1);
        if (!bVar2) goto LAB_00545820;
        QByteArray::~QByteArray((QByteArray *)0x5457ed);
      }
    }
  }
  QByteArray::QByteArray((QByteArray *)0x545818);
LAB_00545820:
  QByteArray::~QByteArray((QByteArray *)0x54582d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pos_00;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray parseHtmlMetaForEncoding(QByteArrayView data)
{
    static constexpr auto metaSearcher = qMakeStaticByteArrayMatcher("meta ");
    static constexpr auto charsetSearcher = qMakeStaticByteArrayMatcher("charset=");

    QByteArray header = data.first(qMin(data.size(), qsizetype(1024))).toByteArray().toLower();
    qsizetype pos = metaSearcher.indexIn(header);
    if (pos != -1) {
        pos = charsetSearcher.indexIn(header, pos);
        if (pos != -1) {
            pos += qstrlen("charset=");
            if (pos < header.size() && (header.at(pos) == '\"' || header.at(pos) == '\''))
                ++pos;

            qsizetype pos2 = pos;
            // The attribute can be closed with either """, "'", ">" or "/",
            // none of which are valid charset characters.
            while (++pos2 < header.size()) {
                char ch = header.at(pos2);
                if (ch == '\"' || ch == '\'' || ch == '>' || ch == '/') {
                    QByteArray name = header.mid(pos, pos2 - pos);
                    qsizetype colon = name.indexOf(':');
                    if (colon > 0)
                        name = name.left(colon);
                    name = name.simplified();
                    if (name == "unicode") // QTBUG-41998, ICU will return UTF-16.
                        name = QByteArrayLiteral("UTF-8");
                    if (!name.isEmpty())
                        return name;
                }
            }
        }
    }
    return QByteArray();
}